

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::Matchers::StringMatcherBase::describe_abi_cxx11_(StringMatcherBase *this)

{
  StringRef rhs;
  StringRef rhs_00;
  size_type sVar1;
  char *in_RSI;
  string *in_RDI;
  string *description;
  string *lhs;
  StringRef local_28;
  undefined1 local_11;
  
  local_11 = 0;
  lhs = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  sVar1 = StringRef::size((StringRef *)(in_RSI + 0x50));
  std::__cxx11::string::size();
  local_28 = CasedString::caseSensitivitySuffix((CasedString *)0x19a9a4);
  StringRef::size(&local_28);
  std::__cxx11::string::reserve((ulong)in_RDI);
  rhs.m_size = sVar1;
  rhs.m_start = in_RSI;
  operator+=(lhs,rhs);
  std::__cxx11::string::operator+=((string *)in_RDI,": \"");
  std::__cxx11::string::operator+=((string *)in_RDI,(string *)(in_RSI + 0x30));
  std::__cxx11::string::operator+=((string *)in_RDI,'\"');
  CasedString::caseSensitivitySuffix((CasedString *)0x19aa39);
  rhs_00.m_size = sVar1;
  rhs_00.m_start = in_RSI;
  operator+=(lhs,rhs_00);
  return lhs;
}

Assistant:

std::string StringMatcherBase::describe() const {
        std::string description;
        description.reserve(5 + m_operation.size() + m_comparator.m_str.size() +
                                    m_comparator.caseSensitivitySuffix().size());
        description += m_operation;
        description += ": \"";
        description += m_comparator.m_str;
        description += '"';
        description += m_comparator.caseSensitivitySuffix();
        return description;
    }